

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

char * get_top_domain(char *domain,size_t *outlen)

{
  void *pvVar1;
  char *local_40;
  char *last;
  char *first;
  size_t len;
  size_t *outlen_local;
  char *domain_local;
  
  last = (char *)0x0;
  if (domain == (char *)0x0) {
    domain_local = (char *)0x0;
  }
  else {
    first = (char *)strlen(domain);
    pvVar1 = Curl_memrchr(domain,0x2e,(size_t)first);
    if ((pvVar1 != (void *)0x0) &&
       (last = (char *)Curl_memrchr(domain,0x2e,(long)pvVar1 - (long)domain), last != (char *)0x0))
    {
      last = last + 1;
      first = first + -((long)last - (long)domain);
    }
    if (outlen != (size_t *)0x0) {
      *outlen = (size_t)first;
    }
    local_40 = domain;
    if (last != (char *)0x0) {
      local_40 = last;
    }
    domain_local = local_40;
  }
  return domain_local;
}

Assistant:

static const char *get_top_domain(const char * const domain, size_t *outlen)
{
  size_t len;
  const char *first = NULL, *last;

  if(!domain)
    return NULL;

  len = strlen(domain);
  last = memrchr(domain, '.', len);
  if(last) {
    first = memrchr(domain, '.', (last - domain));
    if(first)
      len -= (++first - domain);
  }

  if(outlen)
    *outlen = len;

  return first? first: domain;
}